

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O2

void __thiscall mario::EPoller::~EPoller(EPoller *this)

{
  close(this->_epollfd);
  std::
  _Rb_tree<int,_std::pair<const_int,_mario::Channel_*>,_std::_Select1st<std::pair<const_int,_mario::Channel_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_mario::Channel_*>_>_>
  ::~_Rb_tree(&(this->_channels)._M_t);
  std::_Vector_base<epoll_event,_std::allocator<epoll_event>_>::~_Vector_base
            (&(this->_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>);
  return;
}

Assistant:

EPoller::~EPoller() {
    ::close(_epollfd);
}